

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

bool __thiscall
duckdb_re2::Regexp::RequiredPrefix(Regexp *this,string *prefix,bool *foldcase,Regexp **suffix)

{
  ushort uVar1;
  uint16_t uVar2;
  Regexp *pRVar3;
  ulong uVar4;
  Regexp *pRVar5;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar6;
  uint8_t uVar7;
  int nrunes;
  long lVar8;
  uint uVar9;
  anon_union_16_7_f91e83de_for_arguments *runes;
  int j;
  ulong uVar10;
  bool bVar11;
  anon_union_8_2_3df47e5c_for_Regexp_7 *local_48;
  
  prefix->_M_string_length = 0;
  *(prefix->_M_dataplus)._M_p = '\0';
  *foldcase = false;
  *suffix = (Regexp *)0x0;
  if (this->op_ == '\x05') {
    uVar1 = this->nsub_;
    uVar4 = (ulong)uVar1;
    if (uVar1 != 0) {
      local_48 = &this->field_5;
      paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      if (uVar1 == 1) {
        paVar6 = local_48;
      }
      lVar8 = -8;
      uVar10 = 1;
      do {
        if ((paVar6[uVar10 - 1].subone_)->op_ != '\x12') {
          if (uVar10 == 1) {
            return false;
          }
          pRVar3 = ((anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_)[uVar10 - 1].
                   subone_;
          uVar7 = pRVar3->op_;
          if (1 < (byte)(uVar7 - 3)) {
            return false;
          }
          uVar9 = (uint)uVar10;
          if (uVar9 < uVar1) {
            do {
              paVar6 = local_48;
              if (1 < (ushort)uVar4) {
                paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
              }
              Incref(paVar6[uVar10].subone_);
              uVar10 = uVar10 + 1;
              uVar1 = this->nsub_;
              uVar4 = (ulong)uVar1;
            } while (uVar10 < uVar1);
            if (1 < uVar1) {
              local_48 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
            }
            pRVar5 = ConcatOrAlternate(kRegexpConcat,(Regexp **)((long)local_48 - lVar8),
                                       uVar1 - uVar9,(uint)this->parse_flags_,false);
            uVar7 = pRVar3->op_;
          }
          else {
            pRVar5 = (Regexp *)operator_new(0x28);
            uVar2 = this->parse_flags_;
            pRVar5->op_ = '\x02';
            pRVar5->simple_ = '\0';
            pRVar5->parse_flags_ = uVar2;
            pRVar5->ref_ = 1;
            *(undefined8 *)((long)&pRVar5->down_ + 6) = 0;
            *(undefined8 *)((long)&(pRVar5->arguments).char_class.cc_ + 6) = 0;
            *(undefined8 *)&pRVar5->nsub_ = 0;
            *(undefined8 *)((long)&pRVar5->field_5 + 6) = 0;
            *(undefined2 *)((long)&pRVar5->arguments + 0xe) = 0;
          }
          *suffix = pRVar5;
          if (uVar7 == '\x03') {
            runes = &pRVar3->arguments;
            nrunes = 1;
          }
          else {
            runes = (anon_union_16_7_f91e83de_for_arguments *)
                    (pRVar3->arguments).literal_string.runes_;
            nrunes = (pRVar3->arguments).repeat.max_;
          }
          ConvertRunesToBytes(SUB41((pRVar3->parse_flags_ & 0x20) >> 5,0),&runes->rune_,nrunes,
                              prefix);
          *foldcase = (bool)((byte)pRVar3->parse_flags_ & 1);
          return true;
        }
        lVar8 = lVar8 + -8;
        bVar11 = uVar10 != uVar4;
        uVar10 = uVar10 + 1;
      } while (bVar11);
    }
  }
  return false;
}

Assistant:

bool Regexp::RequiredPrefix(std::string* prefix, bool* foldcase,
                            Regexp** suffix) {
  prefix->clear();
  *foldcase = false;
  *suffix = NULL;

  // No need for a walker: the regexp must be of the form
  // 1. some number of ^ anchors
  // 2. a literal char or string
  // 3. the rest
  if (op_ != kRegexpConcat)
    return false;
  int i = 0;
  while (i < nsub_ && sub()[i]->op_ == kRegexpBeginText)
    i++;
  if (i == 0 || i >= nsub_)
    return false;
  Regexp* re = sub()[i];
  if (re->op_ != kRegexpLiteral &&
      re->op_ != kRegexpLiteralString)
    return false;
  i++;
  if (i < nsub_) {
    for (int j = i; j < nsub_; j++)
      sub()[j]->Incref();
    *suffix = Concat(sub() + i, nsub_ - i, parse_flags());
  } else {
    *suffix = new Regexp(kRegexpEmptyMatch, parse_flags());
  }

  bool latin1 = (re->parse_flags() & Latin1) != 0;
  Rune* runes = re->op_ == kRegexpLiteral ? &re->arguments.rune_ : re->arguments.literal_string.runes_;
  int nrunes = re->op_ == kRegexpLiteral ? 1 : re->arguments.literal_string.nrunes_;
  ConvertRunesToBytes(latin1, runes, nrunes, prefix);
  *foldcase = (re->parse_flags() & FoldCase) != 0;
  return true;
}